

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<char,long_long>(void)

{
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  undefined7 uStack_58;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  longlong local_50;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_41;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  longlong u;
  
  u = 0;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long_long>
            (&local_41,&u);
  su.m_int = u;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long_long>(&st2,&su);
  local_41.m_int = '\0';
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,&u);
  SafeCastHelper<char,_long_long,_4>::
  CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(su.m_int,(char *)&local_41);
  local_41.m_int = st2.m_int;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,u);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*(&local_41,st2);
  operator*(u,local_41);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,u);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,su);
  u = 1;
  local_50._0_4_ = 1;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,
             (int *)&local_50);
  su.m_int = 1;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,u);
  local_50._0_4_ = 1;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
             (int *)&local_50);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%(&local_41,st2);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,u);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,su);
  u = 1;
  local_50._0_4_ = 1;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
             (int *)&local_50);
  local_50._0_4_ = 1;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,
             (int *)&local_50);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,u);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/(&local_41,st2);
  operator/(u,local_41);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,u);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,su);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,u);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+(&local_41,st2);
  operator+(u,local_41);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,u);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,su);
  local_50._0_4_ = 0;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,
             (int *)&local_50);
  u = 0;
  local_50._0_4_ = 0;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&st2,
             (int *)&local_50);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,u);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-(&local_41,st2);
  operator-(CONCAT17(st2.m_int,uStack_58),
            (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,u);
  local_50 = CONCAT44(local_50._4_4_,1);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,
             (int *)&local_50);
  su.m_int = 1;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,
             (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
  u = 1;
  su.m_int = 1;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,1);
  SVar1 = SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                    ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41
                     ,su);
  operator<<(SVar1.m_int,su);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,u);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,su);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,u);
  SVar1 = SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                    ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41
                     ,su);
  operator>>(SVar1.m_int,su);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,u);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter> *)&local_41,su);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&(&local_41,st2);
  local_50 = BinaryAndHelper<long_long,_char,_1>::And(su.m_int,local_41.m_int & (byte)u);
  SafeInt::operator_cast_to_char((SafeInt *)&local_50);
  local_41.m_int = (byte)su.m_int & (byte)u & local_41.m_int & st2.m_int;
  local_50 = BinaryOrHelper<long_long,_char,_1>::Or(su.m_int,(byte)u);
  SafeInt::operator_cast_to_char((SafeInt *)&local_50);
  local_41.m_int = (byte)su.m_int | (byte)u | local_41.m_int | st2.m_int;
  local_50 = BinaryXorHelper<long_long,_char,_1>::Xor(su.m_int,local_41.m_int ^ (byte)u);
  SafeInt::operator_cast_to_char((SafeInt *)&local_50);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}